

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

void __thiscall CBlockPolicyEstimator::FlushFeeEstimates(CBlockPolicyEstimator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  AutoFile local_80;
  path local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.m_file = (FILE *)fsbridge::fopen((char *)&this->m_estimation_filepath,"wb");
  local_80.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((FILE *)local_80.m_file != (FILE *)0x0) {
    bVar3 = Write(this,&local_80);
    if (bVar3) {
      fs::path::filename((path *)&local_60,&this->m_estimation_filepath);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,local_60._M_pathname._M_dataplus._M_p,
                 local_60._M_pathname._M_dataplus._M_p + local_60._M_pathname._M_string_length);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      logging_function._M_str = "FlushFeeEstimates";
      logging_function._M_len = 0x11;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x3bc,ALL,Info,"Flushed fee estimates to %s.\n",
                 &local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_60);
      goto LAB_00985910;
    }
  }
  pcVar2 = (this->m_estimation_filepath).super_path._M_pathname._M_dataplus._M_p;
  paVar1 = &local_60._M_pathname.field_2;
  local_60._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,pcVar2,
             pcVar2 + (this->m_estimation_filepath).super_path._M_pathname._M_string_length);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp";
  source_file_00._M_len = 0x58;
  logging_function_00._M_str = "FlushFeeEstimates";
  logging_function_00._M_len = 0x11;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function_00,source_file_00,0x3ba,ALL,Info,
             "Failed to write fee estimates to %s. Continue anyway.\n",&local_60._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_pathname._M_dataplus._M_p,
                    local_60._M_pathname.field_2._M_allocated_capacity + 1);
  }
LAB_00985910:
  AutoFile::~AutoFile(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::FlushFeeEstimates()
{
    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "wb")};
    if (est_file.IsNull() || !Write(est_file)) {
        LogPrintf("Failed to write fee estimates to %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    } else {
        LogPrintf("Flushed fee estimates to %s.\n", fs::PathToString(m_estimation_filepath.filename()));
    }
}